

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

Subprocess * __thiscall SubprocessSet::Add(SubprocessSet *this,string *command,bool use_console)

{
  bool bVar1;
  SubprocessSet *pSVar2;
  SubprocessSet *local_30;
  Subprocess *subprocess;
  string *psStack_20;
  bool use_console_local;
  string *command_local;
  SubprocessSet *this_local;
  
  subprocess._7_1_ = use_console;
  psStack_20 = command;
  command_local = (string *)this;
  pSVar2 = (SubprocessSet *)operator_new(0x30);
  Subprocess::Subprocess((Subprocess *)pSVar2,(bool)(subprocess._7_1_ & 1));
  local_30 = pSVar2;
  bVar1 = Subprocess::Start((Subprocess *)pSVar2,this,psStack_20);
  pSVar2 = local_30;
  if (bVar1) {
    std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::push_back
              (&this->running_,(value_type *)&local_30);
    this_local = local_30;
  }
  else {
    if (local_30 != (SubprocessSet *)0x0) {
      Subprocess::~Subprocess((Subprocess *)local_30);
      operator_delete(pSVar2,0x30);
    }
    this_local = (SubprocessSet *)0x0;
  }
  return (Subprocess *)this_local;
}

Assistant:

Subprocess *SubprocessSet::Add(const string& command, bool use_console) {
  Subprocess *subprocess = new Subprocess(use_console);
  if (!subprocess->Start(this, command)) {
    delete subprocess;
    return 0;
  }
  running_.push_back(subprocess);
  return subprocess;
}